

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimation2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  Node *pNVar1;
  runtime_error *this_00;
  long *in_RDX;
  Ref<embree::SceneGraph::Node> local_80;
  Ref<embree::SceneGraph::Node> local_78;
  Ref<embree::SceneGraph::Node> local_70;
  Ref<embree::SceneGraph::Node> node1;
  string local_48;
  
  if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) == 0x10) {
    loadNode(this,xml);
    loadNode((XMLLoader *)&node1,xml);
    pNVar1 = (Node *)(this->path).filename._M_dataplus._M_p;
    local_70.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    local_78.ptr = node1.ptr;
    if (node1.ptr != (Node *)0x0) {
      (*((node1.ptr)->super_RefCount)._vptr_RefCount[2])(node1.ptr);
    }
    SceneGraph::extend_animation(&local_70,&local_78);
    if (local_78.ptr != (Node *)0x0) {
      (*((local_78.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if (local_70.ptr != (Node *)0x0) {
      (*((local_70.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    local_80.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    SceneGraph::optimize_animation(&local_80);
    if (local_80.ptr != (Node *)0x0) {
      (*((local_80.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if (node1.ptr != (Node *)0x0) {
      (*((node1.ptr)->super_RefCount)._vptr_RefCount[3])(node1.ptr);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_48,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node1,
                 &local_48,": invalid Animation2 node");
  std::runtime_error::runtime_error(this_00,(string *)&node1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimation2Node(const Ref<XML>& xml) 
  {
    if (xml->size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation2 node");
    Ref<SceneGraph::Node> node0 = loadNode(xml->children[0]);
    Ref<SceneGraph::Node> node1 = loadNode(xml->children[1]);
    SceneGraph::extend_animation(node0,node1);
    SceneGraph::optimize_animation(node0);
    return node0;
  }